

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerspectiveMatrix.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  Vec3f center_00;
  Vec3f eye_00;
  int iVar2;
  char *pcVar3;
  float *pfVar4;
  reference pvVar5;
  float fVar6;
  Vec3f VVar7;
  col_type cVar8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_3f8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_3f4;
  Vec2f local_318;
  Vec2f uv [3];
  undefined1 local_2f0 [8];
  Vec4f pr;
  Vec4f cp;
  undefined1 local_2c0 [8];
  Vec3f c;
  size_t j;
  Vec3f triangle [3];
  vector<int,_std::allocator<int>_> face;
  size_t i;
  Matrix projectMatrix;
  undefined1 local_1c4 [8];
  Matrix viewMatrix;
  Vec3f up;
  Vec3f center;
  Vec3f eye;
  TGAImage texture;
  Model model;
  string texture_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string model_path;
  undefined1 local_60 [8];
  TinyRender render;
  TGAColor local_35;
  undefined1 local_30 [8];
  TGAImage framebuffer;
  char **argv_local;
  int argc_local;
  
  framebuffer._16_8_ = argv;
  TRM::TGAImage::TGAImage((TGAImage *)local_30,800,600,3);
  TRM::TGAColor::TGAColor(&local_35,'\0','\0','\0',0xff);
  TRM::TGAImage::clearColor((TGAImage *)local_30,&local_35);
  TRM::TinyRender::TinyRender((TinyRender *)local_60);
  TRM::TinyRender::attachBuffer((TinyRender *)local_60,(TGAImage *)local_30);
  std::operator+(local_80,ASSETS_ROOT_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &model.specularmap_.bytespp,ASSETS_ROOT_abi_cxx11_);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TRM::Model::Model((Model *)&texture.bytespp,pcVar3);
  TRM::TGAImage::TGAImage((TGAImage *)&eye.field_1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TRM::TGAImage::read_tga_file((TGAImage *)&eye.field_1,pcVar3);
  TRM::TGAImage::flip_vertically((TGAImage *)&eye.field_1);
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&center.field_1,0);
  *pfVar4 = 1.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&center.field_1,1);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&center.field_1,2);
  *pfVar4 = 1.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&up.field_1,0);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&up.field_1,1);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&up.field_1,2);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&viewMatrix.value[3].field_2,0);
  *pfVar4 = 0.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&viewMatrix.value[3].field_2,1);
  *pfVar4 = 1.0;
  pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                     ((vec<3,_float,_(glm::qualifier)0> *)&viewMatrix.value[3].field_2,2);
  *pfVar4 = 0.0;
  eye_00.field_2.z = eye.field_0.x;
  eye_00.field_0.x = center.field_1.y;
  eye_00.field_1.y = center.field_2.z;
  center_00.field_2.z = center.field_0.x;
  center_00.field_0.x = up.field_1.y;
  center_00.field_1.y = up.field_2.z;
  projectMatrix.value[3].field_2 = viewMatrix.value[3].field_2;
  projectMatrix.value[3].field_3 = viewMatrix.value[3].field_3;
  VVar7.field_2.z = up.field_0.x;
  VVar7.field_0.x = viewMatrix.value[3].field_2.z;
  VVar7.field_1.y = viewMatrix.value[3].field_3.w;
  TRM::lookAt((Matrix *)local_1c4,eye_00,center_00,VVar7);
  fVar6 = TRM::degToRadian(60.0);
  TRM::perspective((Matrix *)&i,fVar6,1.3333334,0.1,1000.0);
  face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    iVar2 = TRM::Model::nfaces((Model *)&texture.bytespp);
    if ((pointer)(long)iVar2 <=
        face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) break;
    TRM::Model::face((vector<int,_std::allocator<int>_> *)&triangle[2].field_2,
                     (Model *)&texture.bytespp,
                     (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    for (stack0xfffffffffffffd50 = 0; stack0xfffffffffffffd50 < 3;
        register0x00000000 = stack0xfffffffffffffd50 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&triangle[2].field_2,
                          stack0xfffffffffffffd50);
      VVar7 = TRM::Model::vert((Model *)&texture.bytespp,*pvVar5);
      c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar7.field_2;
      local_2c0 = VVar7._0_8_;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,0);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)&pr.field_2,0);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,1);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)&pr.field_2,1);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,2);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)&pr.field_2,2);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)&pr.field_2,3);
      *pfVar4 = 1.0;
      cVar8 = glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_1c4,
                             (row_type *)&pr.field_2);
      local_3f8 = cVar8.field_0;
      aStack_3f4 = cVar8.field_1;
      uv[2].field_0.x = local_3f8.x;
      uv[2].field_1.y = aStack_3f4.y;
      cVar8 = glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&i,(row_type *)(uv + 2));
      pr._0_8_ = cVar8._8_8_;
      local_2f0 = cVar8._0_8_;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)local_2f0,0);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)local_2f0,3);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,0);
      *pfVar4 = fVar6 / fVar1;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)local_2f0,1);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)local_2f0,3);
      fVar1 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,1);
      *pfVar4 = fVar6 / fVar1;
      pfVar4 = glm::vec<4,_float,_(glm::qualifier)0>::operator[]
                         ((vec<4,_float,_(glm::qualifier)0> *)local_2f0,3);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,2);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,0);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,0);
      *pfVar4 = (fVar6 + 1.0) * 800.0 * 0.5 + 0.5;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,1);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,1);
      *pfVar4 = (fVar6 + 1.0) * 600.0 * 0.5 + 0.5;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,0);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffd50 - 1].field_1,0);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,1);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffd50 - 1].field_1,1);
      *pfVar4 = fVar6;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)local_2c0,2);
      fVar6 = *pfVar4;
      pfVar4 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                         ((vec<3,_float,_(glm::qualifier)0> *)
                          &triangle[stack0xfffffffffffffd50 - 1].field_1,2);
      *pfVar4 = fVar6;
    }
    local_318 = TRM::Model::uv((Model *)&texture.bytespp,
                               (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,0);
    uv[0] = TRM::Model::uv((Model *)&texture.bytespp,
                           (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,1);
    uv[1] = TRM::Model::uv((Model *)&texture.bytespp,
                           (int)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,2);
    TRM::TinyRender::triangle
              ((TinyRender *)local_60,(Vec3f *)&j,&local_318,(TGAImage *)&eye.field_1);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&triangle[2].field_2);
    face.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((long)face.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  TRM::TGAImage::flip_vertically((TGAImage *)local_30);
  TRM::TGAImage::write_png_stb((TGAImage *)local_30,"framebuffer.png");
  TRM::TGAImage::~TGAImage((TGAImage *)&eye.field_1);
  TRM::Model::~Model((Model *)&texture.bytespp);
  std::__cxx11::string::~string((string *)&model.specularmap_.bytespp);
  std::__cxx11::string::~string((string *)local_80);
  TRM::TinyRender::~TinyRender((TinyRender *)local_60);
  TRM::TGAImage::~TGAImage((TGAImage *)local_30);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {

    TGAImage framebuffer(WIDTH, HEIGHT, TGAImage::RGB);
    framebuffer.clearColor(TGAColor(0, 0, 0));

    TinyRender render;
    render.attachBuffer(&framebuffer);
    
    std::string model_path = ASSETS_ROOT + "/african_head.obj";
    std::string texture_path = ASSETS_ROOT + "/african_head_diffuse.tga";
    
    Model model(model_path.c_str());


    TGAImage texture;
    texture.read_tga_file(texture_path.c_str());
    texture.flip_vertically();

    Vec3f eye;
    eye[0] = 1.f;
    eye[1] = 0.f;
    eye[2] = 1.f;

    Vec3f center;
    center[0] = 0.f;
    center[1] = 0.f;
    center[2] = 0.f;
    TRM::Vec3f up;
    up[0] = 0.0f;
    up[1] = 1.f;
    up[2] = 0.f;

    Matrix viewMatrix = lookAt(eye, center, up);
    Matrix projectMatrix = perspective(degToRadian(60.0f), 4.f / 3.f, 0.1f, 1000.0f);

    /** draw all vertex triangle ***/
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::vector<int> face = model.face(i);
        Vec3f triangle[3];
        for(size_t j = 0; j < 3; j++) {
            Vec3f c = model.vert(face[j]);
            Vec4f cp;
            cp[0] = c[0];
            cp[1] = c[1];
            cp[2] = c[2];
            cp[3] = 1.f;
            Vec4f pr = projectMatrix * (viewMatrix * cp);
            c[0] = pr[0] / pr[3];
            c[1] = pr[1] / pr[3];
            c[2] = pr[3];

            c[0] = (c[0] + 1.f) * WIDTH / 2.f + .5f;
            c[1] = (c[1] + 1.f) * HEIGHT / 2.f + .5f;
            triangle[j][0] = c[0];
            triangle[j][1] = c[1];
            triangle[j][2] = c[2];
        }


        Vec2f uv[] = { model.uv(i, 0), model.uv(i, 1), model.uv(i, 2) };
        render.triangle(triangle, uv, &texture);
    }
    
    framebuffer.flip_vertically();
    framebuffer.write_png_stb("framebuffer.png");

    return 0;
}